

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::SerReadWriteMany<DataStream,int&,unsigned_int&,CKeyID&>
               (DataStream *s,int *args,uint *args_1,CKeyID *args_2)

{
  long lVar1;
  uint *in_RCX;
  int *in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<DataStream,int&,unsigned_int&,CKeyID&>(in_RSI,in_RDX,in_RCX,(CKeyID *)0x17a51b1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }